

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTableInitExpr
          (BinaryReaderIR *this,Index segment,Index table_index)

{
  char *pcVar1;
  Offset OVar2;
  Result RVar3;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> tVar4;
  Location loc_1;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_100;
  Location local_f8;
  Location local_d8;
  Var local_b8;
  Var local_70;
  
  local_d8.field_1.field_0.line = 0;
  local_d8.field_1.field_0.first_column = 0;
  local_d8.field_1.field_0.last_column = 0;
  local_d8.filename._M_len = 0;
  local_d8.filename._M_str._0_4_ = 0;
  local_d8.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_d8.filename._M_len = strlen(pcVar1);
  local_d8.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_d8.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_d8.field_1.field_0.line = (int)OVar2;
  local_d8.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_70,segment,&local_d8);
  local_f8.field_1.field_0.line = 0;
  local_f8.field_1.field_0.first_column = 0;
  local_f8.field_1.field_0.last_column = 0;
  local_f8.filename._M_len = 0;
  local_f8.filename._M_str._0_4_ = 0;
  local_f8.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_f8.filename._M_len = strlen(pcVar1);
  local_f8.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_f8.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_f8.field_1.field_0.line = (int)OVar2;
  local_f8.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_b8,table_index,&local_f8);
  tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0xd0);
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x34;
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__TableInitExpr_0017dee8;
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),&local_70);
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x88),&local_b8);
  local_100._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_100);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_100._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_100._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  local_100._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableInitExpr(Index segment, Index table_index) {
  return AppendExpr(std::make_unique<TableInitExpr>(
      Var(segment, GetLocation()), Var(table_index, GetLocation())));
}